

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

void __thiscall FIX::FieldMap::FieldMap(FieldMap *this,int *order)

{
  int *order_local;
  FieldMap *this_local;
  
  this->_vptr_FieldMap = (_func_int **)&PTR__FieldMap_0030ba70;
  std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::vector(&this->m_fields);
  std::
  map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
  ::map(&this->m_groups);
  message_order::message_order(&this->m_order,order);
  std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::reserve(&this->m_fields,0x10);
  return;
}

Assistant:

FieldMap::FieldMap( const int order[] )
: m_order(message_order(order))
{
  m_fields.reserve(DEFAULT_SIZE);
}